

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuFieldBase::Draw
          (FOptionMenuFieldBase *this,FOptionMenuDescriptor *param_1,int y,int indent,bool selected)

{
  EColorRange normalcolor;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar1;
  int x;
  undefined4 extraout_var;
  char *string;
  EColorRange local_64;
  byte local_4d;
  FString local_40;
  undefined4 local_34;
  byte bStack_30;
  int overlay;
  byte local_22;
  byte local_21;
  int local_20;
  bool grayed;
  int iStack_1c;
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *param_1_local;
  FOptionMenuFieldBase *this_local;
  
  local_4d = 0;
  local_21 = selected;
  local_20 = indent;
  iStack_1c = y;
  _indent_local = param_1;
  param_1_local = (FOptionMenuDescriptor *)this;
  if (this->mGrayCheck != (FBaseCVar *)0x0) {
    iVar1 = (*this->mGrayCheck->_vptr_FBaseCVar[4])(this->mGrayCheck,0);
    bStack_30 = (byte)iVar1;
    local_4d = bStack_30 ^ 0xff;
    _bStack_30 = CONCAT44(extraout_var,iVar1);
  }
  local_22 = local_4d & 1;
  if ((local_21 & 1) == 0) {
    local_64 = OptionSettings.mFontColor;
  }
  else {
    local_64 = OptionSettings.mFontColorSelection;
  }
  FOptionMenuItem::drawLabel
            (&this->super_FOptionMenuItem,local_20,iStack_1c,local_64,(bool)local_22);
  iVar1 = iStack_1c;
  this_00 = screen;
  font = SmallFont;
  normalcolor = OptionSettings.mFontColorValue;
  local_34 = 0;
  if ((local_22 & 1) != 0) {
    local_34 = 0x60300000;
  }
  x = local_20 + CleanXfac_1 * 0xe;
  (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])();
  string = FString::GetChars(&local_40);
  DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,x,iVar1,string,0x40001394,1,0x400013aa,
                    local_34,0);
  FString::~FString(&local_40);
  return local_20;
}

Assistant:

int Draw ( FOptionMenuDescriptor*, int y, int indent, bool selected )
	{
		bool grayed = mGrayCheck != NULL && !( mGrayCheck->GetGenericRep( CVAR_Bool ).Bool );
		drawLabel( indent, y, selected ? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, grayed );
		int overlay = grayed? MAKEARGB( 96, 48, 0, 0 ) : 0;

		screen->DrawText( SmallFont, OptionSettings.mFontColorValue, indent + CURSORSPACE, y,
			Represent().GetChars(), DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE );
		return indent;
	}